

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v8::detail::
         do_write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>,char,fmt::v8::detail::digit_grouping<char>>
                   (appender out,decimal_fp<double> *fp,basic_format_specs<char> *specs,
                   float_specs fspecs,locale_ref loc)

{
  decimal_fp<double> *pdVar1;
  locale_ref loc_00;
  int iVar2;
  char cVar3;
  int iVar4;
  type tVar5;
  type tVar6;
  appender aVar7;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  sign_t sVar16;
  bool bVar17;
  locale_ref in_stack_fffffffffffffee8;
  char local_10e;
  char zero;
  bool pointy;
  undefined3 uStack_10b;
  int significand_size;
  sign_t sign;
  ulong local_100;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_f8;
  undefined8 local_f0;
  basic_format_specs<char> *local_e8;
  locale_ref local_e0;
  ulong local_d8;
  significand_type significand;
  int local_c8;
  int exp;
  significand_type local_c0;
  float_specs fspecs_local;
  digit_grouping<char> grouping;
  anon_class_40_8_dbbf3351 write;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  
  significand = fp->significand;
  local_f8 = out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  local_f0 = fp;
  local_e8 = specs;
  local_c0 = significand;
  fspecs_local = fspecs;
  iVar4 = get_significand_size<double>(fp);
  zero = '0';
  sVar16 = fspecs._4_4_ >> 8;
  sign = sVar16 & 0xff;
  bVar17 = sign != none;
  significand_size = iVar4;
  tVar5 = to_unsigned<int>(iVar4);
  local_100 = (ulong)(bVar17 + tVar5);
  cVar3 = '.';
  local_d8 = (ulong)fspecs >> 0x20;
  if ((fspecs._4_4_ >> 0x11 & 1) != 0) {
    cVar3 = decimal_point_impl<char>(in_stack_fffffffffffffee8);
  }
  pdVar1 = local_f0;
  iVar10 = local_f0->exponent;
  local_c8 = iVar4 + iVar10 + -1;
  local_10e = cVar3;
  local_e0.locale_ = loc.locale_;
  use_exp_format.fspecs = fspecs;
  use_exp_format.output_exp = local_c8;
  bVar17 = do_write_float<fmt::v8::appender,_fmt::v8::detail::dragonbox::decimal_fp<double>,_char,_fmt::v8::detail::digit_grouping<char>_>
           ::anon_class_12_2_f0c9b3c6::operator()(&use_exp_format);
  uVar14 = local_100;
  uVar13 = fspecs.precision;
  uVar9 = (uint)local_d8;
  if (bVar17) {
    iVar10 = iVar10 + iVar4;
    if ((uVar9 >> 0x14 & 1) == 0) {
      local_f0 = (decimal_fp<double> *)((ulong)local_f0._4_4_ << 0x20);
      if (iVar4 == 1) {
        cVar3 = '\0';
      }
    }
    else {
      iVar12 = 0;
      if (0 < (int)(uVar13 - iVar4)) {
        iVar12 = uVar13 - iVar4;
      }
      local_f0 = (decimal_fp<double> *)CONCAT44(local_f0._4_4_,iVar12);
      tVar5 = to_unsigned<int>(iVar12);
      uVar14 = local_100 + tVar5;
    }
    iVar2 = local_c8;
    iVar12 = 1 - iVar10;
    if (0 < iVar10) {
      iVar12 = local_c8;
    }
    iVar10 = 2;
    if (99 < iVar12) {
      iVar10 = (999 < iVar12) + 3;
    }
    tVar5 = to_unsigned<int>((3 - (uint)(cVar3 == '\0')) + iVar10);
    write._0_8_ = CONCAT44(write._4_4_,sVar16) & 0xffffffff000000ff;
    write.significand = local_c0;
    write.decimal_point = cVar3;
    write.significand_size = iVar4;
    write._24_5_ = CONCAT14('0',(int)local_f0);
    write._24_8_ = CONCAT26(write._30_2_,CONCAT15(((uVar9 >> 0x10 & 1) == 0) << 5,write._24_5_)) |
                   0x450000000000;
    write.output_exp = iVar2;
    if (0 < local_e8->width) {
      aVar7 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_&>
                        ((appender)local_f8.container,local_e8,uVar14 + tVar5,&write);
      return (appender)
             aVar7.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
    }
    aVar7 = do_write_float<fmt::v8::appender,_fmt::v8::detail::dragonbox::decimal_fp<double>,_char,_fmt::v8::detail::digit_grouping<char>_>
            ::anon_class_40_8_dbbf3351::operator()(&write,(iterator)local_f8.container);
    return (appender)
           aVar7.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  }
  iVar12 = pdVar1->exponent;
  iVar10 = iVar4 + iVar12;
  exp = iVar10;
  if (iVar12 < 0) {
    if (iVar10 < 1) {
      uVar11 = -iVar10;
      grouping.sep_.grouping._M_dataplus._M_p._0_4_ = uVar11;
      if (uVar13 < uVar11) {
        grouping.sep_.grouping._M_dataplus._M_p._0_4_ = uVar13;
      }
      if ((int)uVar13 < 0) {
        grouping.sep_.grouping._M_dataplus._M_p._0_4_ = uVar11;
      }
      if (iVar4 != 0) {
        grouping.sep_.grouping._M_dataplus._M_p._0_4_ = uVar11;
      }
      if (iVar4 == 0 && (uint)grouping.sep_.grouping._M_dataplus._M_p == 0) {
        _pointy = CONCAT31(uStack_10b,(char)((uVar9 & 0x100000) >> 0x14));
        if ((local_d8 & 0x100000) == 0) {
          iVar4 = 1;
          goto LAB_0011e740;
        }
      }
      else {
        _pointy = CONCAT31(uStack_10b,1);
      }
      iVar4 = 2;
LAB_0011e740:
      tVar5 = to_unsigned<int>((uint)grouping.sep_.grouping._M_dataplus._M_p);
      write._0_8_ = &sign;
      write.significand = (significand_type)&zero;
      write._16_8_ = &pointy;
      write._24_8_ = &local_10e;
      write._32_8_ = &grouping;
      aVar7 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_>
                        ((appender)local_f8.container,local_e8,(iVar4 + tVar5) + uVar14,
                         (anon_class_56_7_162c6e41 *)&write);
      return (appender)
             aVar7.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
    }
    _pointy = uVar13 - iVar4 & (int)(uVar9 << 0xb) >> 0x1f;
    uVar13 = _pointy;
    if ((int)_pointy < 1) {
      uVar13 = 0;
    }
    tVar5 = to_unsigned<int>(uVar13);
    digit_grouping<char>::digit_grouping(&grouping,local_e0,(bool)((byte)(uVar9 >> 0x11) & 1));
    iVar4 = digit_grouping<char>::count_separators(&grouping,significand_size);
    tVar6 = to_unsigned<int>(iVar4);
    write._0_8_ = &sign;
    write.significand = (significand_type)&significand;
    write._16_8_ = &significand_size;
    write._24_8_ = &exp;
    write._32_8_ = &local_10e;
    bVar8.container =
         (buffer<char> *)
         write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_>
                   (local_f8.container,local_e8,local_100 + tVar6 + (ulong)(tVar5 + 1),
                    (anon_class_64_8_e6ffa566 *)&write);
    goto LAB_0011e6e4;
  }
  tVar5 = to_unsigned<int>(iVar12);
  loc_00.locale_ = local_e0.locale_;
  lVar15 = tVar5 + local_100;
  _pointy = uVar13 - iVar10;
  uVar9 = (uint)local_d8;
  if ((uVar9 >> 0x14 & 1) != 0) {
    if ((char)local_d8 == '\x02' || 0 < (int)_pointy) {
      if ((int)_pointy < 1) goto LAB_0011e64f;
    }
    else {
      _pointy = 1;
    }
    tVar5 = to_unsigned<int>(_pointy);
    lVar15 = lVar15 + (ulong)(tVar5 + 1);
  }
LAB_0011e64f:
  digit_grouping<char>::digit_grouping(&grouping,loc_00,(bool)((byte)(uVar9 >> 0x11) & 1));
  iVar4 = digit_grouping<char>::count_separators(&grouping,significand_size);
  tVar5 = to_unsigned<int>(iVar4);
  write._0_8_ = &sign;
  write.significand = (significand_type)&significand;
  write._16_8_ = &significand_size;
  write._24_8_ = local_f0;
  write._32_8_ = &grouping;
  bVar8.container =
       (buffer<char> *)
       write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_>
                 (local_f8.container,local_e8,lVar15 + (ulong)tVar5,
                  (anon_class_72_9_d68ba176 *)&write);
LAB_0011e6e4:
  std::__cxx11::string::~string((string *)&grouping);
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)bVar8.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& fp,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  constexpr Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   fp.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}